

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder_internal.h
# Opt level: O3

uint32_t __thiscall basist::bitwise_decoder::get_bits(bitwise_decoder *this,uint32_t num_bits)

{
  uint uVar1;
  uint uVar2;
  uint32_t uVar3;
  uint uVar4;
  byte *pbVar5;
  byte *pbVar6;
  uint uVar7;
  bool bVar8;
  
  if (num_bits < 0x1a) {
    if (num_bits == 0) {
      uVar3 = this->m_bit_buf;
      uVar2 = this->m_bit_buf_size;
      uVar4 = 0;
LAB_00151f50:
      this->m_bit_buf = uVar3 >> ((byte)num_bits & 0x1f);
      goto LAB_00151f6f;
    }
    uVar2 = this->m_bit_buf_size;
    uVar3 = this->m_bit_buf;
    pbVar5 = this->m_pBuf;
    do {
      if (num_bits <= uVar2) {
        uVar4 = ~(-1 << ((byte)num_bits & 0x1f)) & uVar3;
        goto LAB_00151f50;
      }
      uVar4 = 0;
      pbVar6 = pbVar5;
      if (pbVar5 < this->m_pBuf_end) {
        pbVar6 = pbVar5 + 1;
        this->m_pBuf = pbVar6;
        uVar4 = (uint)*pbVar5;
      }
      uVar3 = uVar3 | uVar4 << ((byte)uVar2 & 0x1f);
      this->m_bit_buf = uVar3;
      uVar2 = uVar2 + 8;
      this->m_bit_buf_size = uVar2;
      pbVar5 = pbVar6;
    } while (uVar2 < 0x21);
  }
  else {
    if (0x20 < num_bits) {
      __assert_fail("num_bits <= 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder_internal.h"
                    ,0x160,"uint32_t basist::bitwise_decoder::get_bits(uint32_t)");
    }
    uVar2 = this->m_bit_buf_size;
    pbVar5 = this->m_pBuf;
    uVar1 = this->m_bit_buf;
    pbVar6 = pbVar5;
    uVar4 = uVar2;
    if (uVar2 < 0x19) {
      do {
        uVar2 = 0;
        pbVar5 = pbVar6;
        if (pbVar6 < this->m_pBuf_end) {
          pbVar5 = pbVar6 + 1;
          this->m_pBuf = pbVar5;
          uVar2 = (uint)*pbVar6;
        }
        uVar1 = uVar1 | uVar2 << ((byte)uVar4 & 0x1f);
        this->m_bit_buf = uVar1;
        uVar2 = uVar4 + 8;
        this->m_bit_buf_size = uVar2;
        bVar8 = uVar4 < 0x11;
        pbVar6 = pbVar5;
        uVar4 = uVar2;
      } while (bVar8);
    }
    uVar7 = uVar1 >> 0x19;
    this->m_bit_buf = uVar7;
    uVar2 = uVar2 - 0x19;
    this->m_bit_buf_size = uVar2;
    num_bits = num_bits - 0x19;
    if (num_bits == 0) {
      uVar4 = 0;
LAB_00151f5e:
      uVar4 = uVar1 & 0x1ffffff | uVar4;
      this->m_bit_buf = uVar7 >> ((byte)num_bits & 0x1f);
LAB_00151f6f:
      this->m_bit_buf_size = uVar2 - num_bits;
      return uVar4;
    }
    if (0x19 < num_bits) {
      __assert_fail("num_bits <= 25",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder_internal.h"
                    ,0x144,"uint32_t basist::bitwise_decoder::peek_bits(uint32_t)");
    }
    do {
      if (num_bits <= uVar2) {
        uVar4 = (~(-1 << ((byte)num_bits & 0x1f)) & uVar7) << 0x19;
        goto LAB_00151f5e;
      }
      uVar4 = 0;
      pbVar6 = pbVar5;
      if (pbVar5 < this->m_pBuf_end) {
        pbVar6 = pbVar5 + 1;
        this->m_pBuf = pbVar6;
        uVar4 = (uint)*pbVar5;
      }
      uVar7 = uVar7 | uVar4 << ((byte)uVar2 & 0x1f);
      this->m_bit_buf = uVar7;
      uVar2 = uVar2 + 8;
      this->m_bit_buf_size = uVar2;
      pbVar5 = pbVar6;
    } while (uVar2 < 0x21);
  }
  __assert_fail("m_bit_buf_size <= 32",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder_internal.h"
                ,0x14e,"uint32_t basist::bitwise_decoder::peek_bits(uint32_t)");
}

Assistant:

uint32_t get_bits(uint32_t num_bits)
		{
			if (num_bits > 25)
			{
				assert(num_bits <= 32);

				const uint32_t bits0 = peek_bits(25);
				m_bit_buf >>= 25;
				m_bit_buf_size -= 25;
				num_bits -= 25;

				const uint32_t bits = peek_bits(num_bits);
				m_bit_buf >>= num_bits;
				m_bit_buf_size -= num_bits;

				return bits0 | (bits << 25);
			}

			const uint32_t bits = peek_bits(num_bits);

			m_bit_buf >>= num_bits;
			m_bit_buf_size -= num_bits;

			return bits;
		}